

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O2

void __thiscall
Clasp::SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject> *this,SolveAlgorithm *x)

{
  SolveAlgorithm *pSVar1;
  
  pSVar1 = (SolveAlgorithm *)(this->ptr_ & 0xfffffffffffffffe);
  if (((this->ptr_ & 1) != 0 && pSVar1 != x) &&
     (this->ptr_ = (uintp)pSVar1, pSVar1 != (SolveAlgorithm *)0x0)) {
    (*pSVar1->_vptr_SolveAlgorithm[1])();
  }
  this->ptr_ = (ulong)x | 1;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}